

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorProto::SerializeWithCachedSizes
          (DescriptorProto *this,CodedOutputStream *output)

{
  RepeatedPtrField<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_00;
  uint uVar1;
  int iVar2;
  string *psVar3;
  char *data;
  Type *pTVar4;
  Type *value;
  Type *value_00;
  Type *value_01;
  Type *value_02;
  Type *value_03;
  Type *pTVar5;
  UnknownFieldSet *unknown_fields;
  int iVar6;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 1) != 0) {
    psVar3 = (this->name_).ptr_;
    internal::WireFormatLite::VerifyUtf8String
              ((psVar3->_M_dataplus)._M_p,(int)psVar3->_M_string_length,SERIALIZE,
               "google.protobuf.DescriptorProto.name");
    internal::WireFormatLite::WriteStringMaybeAliased(1,(this->name_).ptr_,output);
  }
  iVar2 = (this->field_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar2 != iVar6; iVar6 = iVar6 + 1) {
    pTVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->field_).super_RepeatedPtrFieldBase,iVar6);
    internal::WireFormatLite::WriteMessageMaybeToArray(2,(MessageLite *)pTVar4,output);
  }
  iVar2 = (this->nested_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar2 != iVar6; iVar6 = iVar6 + 1) {
    value = internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                      (&(this->nested_type_).super_RepeatedPtrFieldBase,iVar6);
    internal::WireFormatLite::WriteMessageMaybeToArray(3,(MessageLite *)value,output);
  }
  iVar2 = (this->enum_type_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar2 != iVar6; iVar6 = iVar6 + 1) {
    value_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&(this->enum_type_).super_RepeatedPtrFieldBase,iVar6);
    internal::WireFormatLite::WriteMessageMaybeToArray(4,(MessageLite *)value_00,output);
  }
  iVar2 = (this->extension_range_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar2 != iVar6; iVar6 = iVar6 + 1) {
    value_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                         (&(this->extension_range_).super_RepeatedPtrFieldBase,iVar6);
    internal::WireFormatLite::WriteMessageMaybeToArray(5,(MessageLite *)value_01,output);
  }
  iVar2 = (this->extension_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar2 != iVar6; iVar6 = iVar6 + 1) {
    pTVar4 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(this->extension_).super_RepeatedPtrFieldBase,iVar6);
    internal::WireFormatLite::WriteMessageMaybeToArray(6,(MessageLite *)pTVar4,output);
  }
  if ((uVar1 & 2) != 0) {
    internal::WireFormatLite::WriteMessageMaybeToArray(7,(MessageLite *)this->options_,output);
  }
  iVar2 = (this->oneof_decl_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar2 != iVar6; iVar6 = iVar6 + 1) {
    value_02 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::OneofDescriptorProto>::TypeHandler>
                         (&(this->oneof_decl_).super_RepeatedPtrFieldBase,iVar6);
    internal::WireFormatLite::WriteMessageMaybeToArray(8,(MessageLite *)value_02,output);
  }
  iVar2 = (this->reserved_range_).super_RepeatedPtrFieldBase.current_size_;
  for (iVar6 = 0; iVar2 != iVar6; iVar6 = iVar6 + 1) {
    value_03 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::TypeHandler>
                         (&(this->reserved_range_).super_RepeatedPtrFieldBase,iVar6);
    internal::WireFormatLite::WriteMessageMaybeToArray(9,(MessageLite *)value_03,output);
  }
  iVar2 = (this->reserved_name_).super_RepeatedPtrFieldBase.current_size_;
  iVar6 = 0;
  if (iVar2 < 1) {
    iVar2 = iVar6;
  }
  this_00 = &this->reserved_name_;
  for (; iVar2 != iVar6; iVar6 = iVar6 + 1) {
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar6);
    data = (pTVar5->_M_dataplus)._M_p;
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar6);
    internal::WireFormatLite::VerifyUtf8String
              (data,(int)pTVar5->_M_string_length,SERIALIZE,
               "google.protobuf.DescriptorProto.reserved_name");
    pTVar5 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                       (&this_00->super_RepeatedPtrFieldBase,iVar6);
    internal::WireFormatLite::WriteString(10,pTVar5,output);
  }
  if (((ulong)(this->_internal_metadata_).
              super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
              .ptr_ & 1) == 0) {
    return;
  }
  unknown_fields = DescriptorProto::unknown_fields(this);
  internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  return;
}

Assistant:

void DescriptorProto::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:google.protobuf.DescriptorProto)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional string name = 1;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.name");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      1, this->name(), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto field = 2;
  for (unsigned int i = 0, n = this->field_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      2, this->field(i), output);
  }

  // repeated .google.protobuf.DescriptorProto nested_type = 3;
  for (unsigned int i = 0, n = this->nested_type_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      3, this->nested_type(i), output);
  }

  // repeated .google.protobuf.EnumDescriptorProto enum_type = 4;
  for (unsigned int i = 0, n = this->enum_type_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      4, this->enum_type(i), output);
  }

  // repeated .google.protobuf.DescriptorProto.ExtensionRange extension_range = 5;
  for (unsigned int i = 0, n = this->extension_range_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      5, this->extension_range(i), output);
  }

  // repeated .google.protobuf.FieldDescriptorProto extension = 6;
  for (unsigned int i = 0, n = this->extension_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      6, this->extension(i), output);
  }

  // optional .google.protobuf.MessageOptions options = 7;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      7, *this->options_, output);
  }

  // repeated .google.protobuf.OneofDescriptorProto oneof_decl = 8;
  for (unsigned int i = 0, n = this->oneof_decl_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      8, this->oneof_decl(i), output);
  }

  // repeated .google.protobuf.DescriptorProto.ReservedRange reserved_range = 9;
  for (unsigned int i = 0, n = this->reserved_range_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessageMaybeToArray(
      9, this->reserved_range(i), output);
  }

  // repeated string reserved_name = 10;
  for (int i = 0, n = this->reserved_name_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
      this->reserved_name(i).data(), this->reserved_name(i).length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE,
      "google.protobuf.DescriptorProto.reserved_name");
    ::google::protobuf::internal::WireFormatLite::WriteString(
      10, this->reserved_name(i), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:google.protobuf.DescriptorProto)
}